

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
* __thiscall
cfd::core::
JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_ElementsDecodeRawTransactionTxOutStruct>
::ConvertToStruct(vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
                  *__return_storage_ptr__,
                 JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_ElementsDecodeRawTransactionTxOutStruct>
                 *this)

{
  pointer pEVar1;
  pointer this_00;
  ElementsDecodeRawTransactionTxOutStruct data;
  ElementsDecodeRawTransactionTxOutStruct EStack_288;
  
  (__return_storage_ptr__->
  super__Vector_base<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar1 = (this->super_JsonVector<cfd::api::json::ElementsDecodeRawTransactionTxOut>).
           super_vector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>
           .
           super__Vector_base<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_JsonVector<cfd::api::json::ElementsDecodeRawTransactionTxOut>).
                 super_vector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>
                 .
                 super__Vector_base<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pEVar1; this_00 = this_00 + 1
      ) {
    cfd::api::json::ElementsDecodeRawTransactionTxOut::ConvertToStruct(&EStack_288,this_00);
    ::std::
    vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
    ::push_back(__return_storage_ptr__,&EStack_288);
    ElementsDecodeRawTransactionTxOutStruct::~ElementsDecodeRawTransactionTxOutStruct(&EStack_288);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }